

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_read_server_key_exchange(SSL_HANDSHAKE *hs)

{
  uint uVar1;
  uint uVar2;
  Span<const_unsigned_char> in;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  pointer psVar7;
  uint8_t *puVar8;
  size_t sVar9;
  pointer peVar10;
  cbb_st *pcVar11;
  uchar *local_138;
  size_t sStack_130;
  Span<const_unsigned_char> local_128;
  int local_118;
  undefined1 local_108 [8];
  Array<unsigned_char> transcript_data;
  ScopedCBB transcript;
  CBS signature;
  undefined1 local_b0 [5];
  uint8_t alert;
  uint16_t signature_algorithm;
  CBS parameter;
  undefined1 local_90 [8];
  CBS point;
  uint16_t group_id;
  pointer pcStack_78;
  uint8_t group_type;
  char *raw;
  CBS psk_identity_hint;
  CBS server_key_exchange;
  uint32_t alg_a;
  uint32_t alg_k;
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  msg.raw.len = (size_t)hs->ssl;
  bVar3 = (*((SSL *)msg.raw.len)->method->get_message)((SSL *)msg.raw.len,(SSLMessage *)&alg_a);
  if (!bVar3) {
    return ssl_hs_read_message;
  }
  if (alg_a._1_1_ != '\f') {
    bVar3 = ssl_cipher_requires_server_key_exchange(hs->new_cipher);
    if (!bVar3) {
      hs->state = 10;
      return ssl_hs_ok;
    }
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x3d1);
    ssl_send_alert((SSL *)msg.raw.len,2,10);
    return ssl_hs_error;
  }
  bVar3 = ssl_hash_message(hs,(SSLMessage *)&alg_a);
  if (!bVar3) {
    return ssl_hs_error;
  }
  uVar1 = hs->new_cipher->algorithm_mkey;
  uVar2 = hs->new_cipher->algorithm_auth;
  psk_identity_hint.len._0_1_ = msg.is_v2_hello;
  psk_identity_hint.len._1_1_ = msg.type;
  psk_identity_hint.len._2_6_ = msg._2_6_;
  if ((uVar2 & 8) != 0) {
    iVar5 = CBS_get_u16_length_prefixed((CBS *)&psk_identity_hint.len,(CBS *)&raw);
    if (iVar5 == 0) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,999);
      ssl_send_alert((SSL *)msg.raw.len,2,0x32);
      return ssl_hs_error;
    }
    sVar6 = CBS_len((CBS *)&raw);
    if ((0x80 < sVar6) || (iVar5 = CBS_contains_zero_byte((CBS *)&raw), iVar5 != 0)) {
      ERR_put_error(0x10,0,0x88,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x3f5);
      ssl_send_alert((SSL *)msg.raw.len,2,0x28);
      return ssl_hs_error;
    }
    pcStack_78 = (pointer)0x0;
    sVar6 = CBS_len((CBS *)&raw);
    if ((sVar6 != 0) && (iVar5 = CBS_strdup((CBS *)&raw,&stack0xffffffffffffff88), iVar5 == 0)) {
      ssl_send_alert((SSL *)msg.raw.len,2,0x50);
      return ssl_hs_error;
    }
    std::unique_ptr<char,_bssl::internal::Deleter>::reset(&hs->peer_psk_identity_hint,pcStack_78);
  }
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 4) == 0) {
      ERR_put_error(0x10,0,0xdf,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x423);
      ssl_send_alert((SSL *)msg.raw.len,2,10);
      return ssl_hs_error;
    }
  }
  else {
    iVar5 = CBS_get_u8((CBS *)&psk_identity_hint.len,(uint8_t *)((long)&point.len + 7));
    if ((((iVar5 == 0) || (point.len._7_1_ != '\x03')) ||
        (iVar5 = CBS_get_u16((CBS *)&psk_identity_hint.len,(uint16_t *)((long)&point.len + 4)),
        iVar5 == 0)) ||
       (iVar5 = CBS_get_u8_length_prefixed((CBS *)&psk_identity_hint.len,(CBS *)local_90),
       iVar5 == 0)) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x411);
      ssl_send_alert((SSL *)msg.raw.len,2,0x32);
      return ssl_hs_error;
    }
    bVar3 = tls1_check_group_id(hs,point.len._4_2_);
    if (!bVar3) {
      ERR_put_error(0x10,0,0xf3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x418);
      ssl_send_alert((SSL *)msg.raw.len,2,0x2f);
      return ssl_hs_error;
    }
    psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
    psVar7->group_id = point.len._4_2_;
    join_0x00000010_0x00000000_ = cbs_st::operator_cast_to_Span((cbs_st *)local_90);
    bVar3 = Array<unsigned_char>::CopyFrom(&hs->peer_key,join_0x00000010_0x00000000_);
    if (!bVar3) {
      return ssl_hs_error;
    }
  }
  puVar8 = CBS_data((CBS *)&msg);
  sVar6 = CBS_len((CBS *)&msg);
  sVar9 = CBS_len((CBS *)&psk_identity_hint.len);
  CBS_init((CBS *)local_b0,puVar8,sVar6 - sVar9);
  bVar3 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
  if (!bVar3) {
    if (uVar2 != 8) {
      __assert_fail("alg_a == SSL_aPSK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x468,"enum ssl_hs_wait_t bssl::do_read_server_key_exchange(SSL_HANDSHAKE *)");
    }
    sVar6 = CBS_len((CBS *)&psk_identity_hint.len);
    if (sVar6 != 0) {
      ERR_put_error(0x10,0,0x97,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x46b);
      ssl_send_alert((SSL *)msg.raw.len,2,0x32);
      return ssl_hs_error;
    }
    goto LAB_00353df2;
  }
  signature.len._6_2_ = 0;
  uVar4 = ssl_protocol_version((SSL *)msg.raw.len);
  if (uVar4 < 0x303) {
    peVar10 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&hs->peer_pubkey);
    bVar3 = tls1_get_legacy_signature_algorithm((uint16_t *)((long)&signature.len + 6),peVar10);
    if (!bVar3) {
      ERR_put_error(0x10,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x441);
      ssl_send_alert((SSL *)msg.raw.len,2,0x2b);
      return ssl_hs_error;
    }
  }
  else {
    iVar5 = CBS_get_u16((CBS *)&psk_identity_hint.len,(uint16_t *)((long)&signature.len + 6));
    uVar4 = signature.len._6_2_;
    if (iVar5 == 0) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x434);
      ssl_send_alert((SSL *)msg.raw.len,2,0x32);
      return ssl_hs_error;
    }
    signature.len._5_1_ = 0x32;
    peVar10 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&hs->peer_pubkey);
    bVar3 = tls12_check_peer_sigalg(hs,(uint8_t *)((long)&signature.len + 5),uVar4,peVar10);
    uVar4 = signature.len._6_2_;
    if (!bVar3) {
      ssl_send_alert((SSL *)msg.raw.len,2,(uint)signature.len._5_1_);
      return ssl_hs_error;
    }
    psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
    psVar7->peer_signature_algorithm = uVar4;
  }
  iVar5 = CBS_get_u16_length_prefixed
                    ((CBS *)&psk_identity_hint.len,(CBS *)((long)&transcript.ctx_.u + 0x18));
  if ((iVar5 == 0) || (sVar6 = CBS_len((CBS *)&psk_identity_hint.len), sVar6 != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x44a);
    ssl_send_alert((SSL *)msg.raw.len,2,0x32);
    return ssl_hs_error;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&transcript_data.size_);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_108);
  pcVar11 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                       &transcript_data.size_);
  sVar6 = CBS_len((CBS *)local_b0);
  iVar5 = CBB_init(pcVar11,sVar6 + 0x40);
  if (iVar5 == 0) {
LAB_00353ba1:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x45a);
    ssl_send_alert((SSL *)msg.raw.len,2,0x50);
    hs_local._4_4_ = ssl_hs_error;
    local_118 = 1;
  }
  else {
    pcVar11 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &transcript_data.size_);
    iVar5 = CBB_add_bytes(pcVar11,(uint8_t *)(*(long *)(msg.raw.len + 0x30) + 0x30),0x20);
    if (iVar5 == 0) goto LAB_00353ba1;
    pcVar11 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &transcript_data.size_);
    iVar5 = CBB_add_bytes(pcVar11,(uint8_t *)(*(long *)(msg.raw.len + 0x30) + 0x10),0x20);
    if (iVar5 == 0) goto LAB_00353ba1;
    pcVar11 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &transcript_data.size_);
    puVar8 = CBS_data((CBS *)local_b0);
    sVar6 = CBS_len((CBS *)local_b0);
    iVar5 = CBB_add_bytes(pcVar11,puVar8,sVar6);
    if (iVar5 == 0) goto LAB_00353ba1;
    pcVar11 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &transcript_data.size_);
    bVar3 = CBBFinishArray(pcVar11,(Array<unsigned_char> *)local_108);
    sVar6 = msg.raw.len;
    if (!bVar3) goto LAB_00353ba1;
    local_128 = cbs_st::operator_cast_to_Span((cbs_st *)((long)&transcript.ctx_.u + 0x18));
    uVar4 = signature.len._6_2_;
    peVar10 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&hs->peer_pubkey);
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_138,(Array<unsigned_char> *)local_108);
    in.size_ = sStack_130;
    in.data_ = local_138;
    bVar3 = ssl_public_key_verify((SSL *)sVar6,local_128,uVar4,peVar10,in);
    if (bVar3) {
      local_118 = 0;
    }
    else {
      ERR_put_error(0x10,0,0x72,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x462);
      ssl_send_alert((SSL *)msg.raw.len,2,0x33);
      hs_local._4_4_ = ssl_hs_error;
      local_118 = 1;
    }
  }
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_108);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&transcript_data.size_);
  if (local_118 != 0) {
    return hs_local._4_4_;
  }
LAB_00353df2:
  (**(code **)(*(long *)msg.raw.len + 0x20))(msg.raw.len);
  hs->state = 10;
  return ssl_hs_ok;
}

Assistant:

static enum ssl_hs_wait_t do_read_server_key_exchange(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (msg.type != SSL3_MT_SERVER_KEY_EXCHANGE) {
    // Some ciphers (pure PSK) have an optional ServerKeyExchange message.
    if (ssl_cipher_requires_server_key_exchange(hs->new_cipher)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
      return ssl_hs_error;
    }

    hs->state = state_read_certificate_request;
    return ssl_hs_ok;
  }

  if (!ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  uint32_t alg_k = hs->new_cipher->algorithm_mkey;
  uint32_t alg_a = hs->new_cipher->algorithm_auth;
  CBS server_key_exchange = msg.body;
  if (alg_a & SSL_aPSK) {
    CBS psk_identity_hint;

    // Each of the PSK key exchanges begins with a psk_identity_hint.
    if (!CBS_get_u16_length_prefixed(&server_key_exchange,
                                     &psk_identity_hint)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      return ssl_hs_error;
    }

    // Store the PSK identity hint for the ClientKeyExchange. Assume that the
    // maximum length of a PSK identity hint can be as long as the maximum
    // length of a PSK identity. Also do not allow NULL characters; identities
    // are saved as C strings.
    //
    // TODO(davidben): Should invalid hints be ignored? It's a hint rather than
    // a specific identity.
    if (CBS_len(&psk_identity_hint) > PSK_MAX_IDENTITY_LEN ||
        CBS_contains_zero_byte(&psk_identity_hint)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_HANDSHAKE_FAILURE);
      return ssl_hs_error;
    }

    // Save non-empty identity hints as a C string. Empty identity hints we
    // treat as missing. Plain PSK makes it possible to send either no hint
    // (omit ServerKeyExchange) or an empty hint, while ECDHE_PSK can only spell
    // empty hint. Having different capabilities is odd, so we interpret empty
    // and missing as identical.
    char *raw = nullptr;
    if (CBS_len(&psk_identity_hint) != 0 &&
        !CBS_strdup(&psk_identity_hint, &raw)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return ssl_hs_error;
    }
    hs->peer_psk_identity_hint.reset(raw);
  }

  if (alg_k & SSL_kECDHE) {
    // Parse the server parameters.
    uint8_t group_type;
    uint16_t group_id;
    CBS point;
    if (!CBS_get_u8(&server_key_exchange, &group_type) ||
        group_type != NAMED_CURVE_TYPE ||
        !CBS_get_u16(&server_key_exchange, &group_id) ||
        !CBS_get_u8_length_prefixed(&server_key_exchange, &point)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      return ssl_hs_error;
    }

    // Ensure the group is consistent with preferences.
    if (!tls1_check_group_id(hs, group_id)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CURVE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_hs_error;
    }

    // Save the group and peer public key for later.
    hs->new_session->group_id = group_id;
    if (!hs->peer_key.CopyFrom(point)) {
      return ssl_hs_error;
    }
  } else if (!(alg_k & SSL_kPSK)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    return ssl_hs_error;
  }

  // At this point, |server_key_exchange| contains the signature, if any, while
  // |msg.body| contains the entire message. From that, derive a CBS containing
  // just the parameter.
  CBS parameter;
  CBS_init(&parameter, CBS_data(&msg.body),
           CBS_len(&msg.body) - CBS_len(&server_key_exchange));

  // ServerKeyExchange should be signed by the server's public key.
  if (ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
    uint16_t signature_algorithm = 0;
    if (ssl_protocol_version(ssl) >= TLS1_2_VERSION) {
      if (!CBS_get_u16(&server_key_exchange, &signature_algorithm)) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
        return ssl_hs_error;
      }
      uint8_t alert = SSL_AD_DECODE_ERROR;
      if (!tls12_check_peer_sigalg(hs, &alert, signature_algorithm,
                                   hs->peer_pubkey.get())) {
        ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
        return ssl_hs_error;
      }
      hs->new_session->peer_signature_algorithm = signature_algorithm;
    } else if (!tls1_get_legacy_signature_algorithm(&signature_algorithm,
                                                    hs->peer_pubkey.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PEER_ERROR_UNSUPPORTED_CERTIFICATE_TYPE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNSUPPORTED_CERTIFICATE);
      return ssl_hs_error;
    }

    // The last field in |server_key_exchange| is the signature.
    CBS signature;
    if (!CBS_get_u16_length_prefixed(&server_key_exchange, &signature) ||
        CBS_len(&server_key_exchange) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      return ssl_hs_error;
    }

    ScopedCBB transcript;
    Array<uint8_t> transcript_data;
    if (!CBB_init(transcript.get(),
                  2 * SSL3_RANDOM_SIZE + CBS_len(&parameter)) ||
        !CBB_add_bytes(transcript.get(), ssl->s3->client_random,
                       SSL3_RANDOM_SIZE) ||
        !CBB_add_bytes(transcript.get(), ssl->s3->server_random,
                       SSL3_RANDOM_SIZE) ||
        !CBB_add_bytes(transcript.get(), CBS_data(&parameter),
                       CBS_len(&parameter)) ||
        !CBBFinishArray(transcript.get(), &transcript_data)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return ssl_hs_error;
    }

    if (!ssl_public_key_verify(ssl, signature, signature_algorithm,
                               hs->peer_pubkey.get(), transcript_data)) {
      // bad signature
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SIGNATURE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
      return ssl_hs_error;
    }
  } else {
    // PSK ciphers are the only supported certificate-less ciphers.
    assert(alg_a == SSL_aPSK);

    if (CBS_len(&server_key_exchange) > 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXTRA_DATA_IN_MESSAGE);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      return ssl_hs_error;
    }
  }

  ssl->method->next_message(ssl);
  hs->state = state_read_certificate_request;
  return ssl_hs_ok;
}